

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O0

SQRex * sqstd_rex_compile(SQChar *pattern,SQChar **error)

{
  int iVar1;
  size_t sVar2;
  SQRexNode *pSVar3;
  SQInteger SVar4;
  void *pvVar5;
  SQRexMatch *pSVar6;
  SQInteger res;
  SQRex *exp;
  SQChar **error_local;
  SQChar *pattern_local;
  
  pattern_local = (SQChar *)sq_malloc(0x68);
  ((SQRex *)pattern_local)->_bol = (SQChar *)0x0;
  ((SQRex *)pattern_local)->_eol = (SQChar *)0x0;
  ((SQRex *)pattern_local)->_p = pattern;
  sVar2 = strlen(pattern);
  ((SQRex *)pattern_local)->_nallocated = sVar2;
  pSVar3 = (SQRexNode *)sq_malloc(((SQRex *)pattern_local)->_nallocated << 5);
  ((SQRex *)pattern_local)->_nodes = pSVar3;
  ((SQRex *)pattern_local)->_nsize = 0;
  ((SQRex *)pattern_local)->_matches = (SQRexMatch *)0x0;
  ((SQRex *)pattern_local)->_nsubexpr = 0;
  SVar4 = sqstd_rex_newnode((SQRex *)pattern_local,0x102);
  ((SQRex *)pattern_local)->_first = SVar4;
  ((SQRex *)pattern_local)->_error = error;
  pvVar5 = (void *)sq_malloc(200);
  ((SQRex *)pattern_local)->_jmpbuf = pvVar5;
  iVar1 = _setjmp((__jmp_buf_tag *)((SQRex *)pattern_local)->_jmpbuf);
  if (iVar1 == 0) {
    SVar4 = sqstd_rex_list((SQRex *)pattern_local);
    ((SQRex *)pattern_local)->_nodes[((SQRex *)pattern_local)->_first].left = SVar4;
    if (*((SQRex *)pattern_local)->_p != '\0') {
      sqstd_rex_error((SQRex *)pattern_local,"unexpected character");
    }
    pSVar6 = (SQRexMatch *)sq_malloc(((SQRex *)pattern_local)->_nsubexpr << 4);
    ((SQRex *)pattern_local)->_matches = pSVar6;
    memset(((SQRex *)pattern_local)->_matches,0,((SQRex *)pattern_local)->_nsubexpr << 4);
  }
  else {
    sqstd_rex_free((SQRex *)pattern_local);
    pattern_local = (SQChar *)0x0;
  }
  return (SQRex *)pattern_local;
}

Assistant:

SQRex *sqstd_rex_compile(const SQChar *pattern,const SQChar **error)
{
    SQRex * volatile exp = (SQRex *)sq_malloc(sizeof(SQRex)); // "volatile" is needed for setjmp()
    exp->_eol = exp->_bol = NULL;
    exp->_p = pattern;
    exp->_nallocated = (SQInteger)scstrlen(pattern) * sizeof(SQChar);
    exp->_nodes = (SQRexNode *)sq_malloc(exp->_nallocated * sizeof(SQRexNode));
    exp->_nsize = 0;
    exp->_matches = 0;
    exp->_nsubexpr = 0;
    exp->_first = sqstd_rex_newnode(exp,OP_EXPR);
    exp->_error = error;
    exp->_jmpbuf = sq_malloc(sizeof(jmp_buf));
    if(setjmp(*((jmp_buf*)exp->_jmpbuf)) == 0) {
        SQInteger res = sqstd_rex_list(exp);
        exp->_nodes[exp->_first].left = res;
        if(*exp->_p!='\0')
            sqstd_rex_error(exp,_SC("unexpected character"));
#ifdef _DEBUG
        {
            SQInteger nsize,i;
            SQRexNode *t;
            nsize = exp->_nsize;
            t = &exp->_nodes[0];
            scprintf(_SC("\n"));
            for(i = 0;i < nsize; i++) {
                if(exp->_nodes[i].type>MAX_CHAR)
                    scprintf(_SC("[%02d] %10s "), (SQInt32)i,g_nnames[exp->_nodes[i].type-MAX_CHAR]);
                else
                    scprintf(_SC("[%02d] %10c "), (SQInt32)i,exp->_nodes[i].type);
                scprintf(_SC("left %02d right %02d next %02d\n"), (SQInt32)exp->_nodes[i].left, (SQInt32)exp->_nodes[i].right, (SQInt32)exp->_nodes[i].next);
            }
            scprintf(_SC("\n"));
        }
#endif
        exp->_matches = (SQRexMatch *) sq_malloc(exp->_nsubexpr * sizeof(SQRexMatch));
        memset(exp->_matches,0,exp->_nsubexpr * sizeof(SQRexMatch));
    }
    else{
        sqstd_rex_free(exp);
        return NULL;
    }
    return exp;
}